

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Group::Add(Group *this,Base *child)

{
  Base *local_20;
  Base *local_18;
  Base *child_local;
  Group *this_local;
  
  local_20 = child;
  local_18 = child;
  child_local = &this->super_Base;
  std::vector<args::Base*,std::allocator<args::Base*>>::emplace_back<args::Base*>
            ((vector<args::Base*,std::allocator<args::Base*>> *)&this->children,&local_20);
  return;
}

Assistant:

void Add(Base &child)
            {
                children.emplace_back(&child);
            }